

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

float * hdr_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float *output;
  void *__ptr;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  float *output_00;
  long lVar16;
  bool bVar17;
  float *local_488;
  char *local_448;
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  
  hdr_gettoken(s,buffer);
  iVar1 = bcmp(buffer,"#?RADIANCE",0xb);
  if (iVar1 == 0) {
    bVar17 = false;
    while (hdr_gettoken(s,buffer), buffer[0] != '\0') {
      iVar1 = bcmp(buffer,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar1 == 0) {
        bVar17 = true;
      }
    }
    if (bVar17) {
      hdr_gettoken(s,buffer);
      iVar1 = bcmp(buffer,"-Y ",3);
      if (iVar1 == 0) {
        local_448 = buffer + 3;
        uVar7 = strtol(local_448,&local_448,10);
        local_448 = local_448 + 2;
        do {
          pcVar11 = local_448;
          local_448 = pcVar11 + 1;
        } while (pcVar11[-2] == ' ');
        if (((pcVar11[-2] == '+') && (pcVar11[-1] == 'X')) && (*pcVar11 == ' ')) {
          iVar2 = 0;
          uVar8 = strtol(local_448,(char **)0x0,10);
          uVar12 = (uint)uVar8;
          *x = uVar12;
          iVar13 = (int)uVar7;
          *y = iVar13;
          *comp = 3;
          iVar1 = 3;
          if (req_comp != 0) {
            iVar1 = req_comp;
          }
          output = (float *)malloc((long)(int)(iVar13 * uVar12 * iVar1) << 2);
          if (uVar12 - 0x8000 < 0xffff8008) goto LAB_00108972;
          uVar9 = 0;
          uVar10 = 0;
          if (0 < iVar13) {
            uVar10 = uVar7 & 0xffffffff;
          }
          __ptr = (void *)0x0;
          local_488 = output;
          while( true ) {
            iVar6 = 1;
            if (uVar9 == uVar10) {
              free(__ptr);
              return output;
            }
            iVar2 = get8(s);
            iVar3 = get8(s);
            uVar4 = get8(s);
            if (((iVar2 != 2) || (iVar3 != 2)) || ((uVar4 & 0x80) != 0)) break;
            uVar5 = get8(s);
            if ((uVar5 | uVar4 << 8) != uVar12) {
              free(output);
              free(__ptr);
              failure_reason = "corrupt HDR";
              return (float *)0x0;
            }
            if (__ptr == (void *)0x0) {
              __ptr = malloc((ulong)(uVar12 * 4));
            }
            pvVar15 = __ptr;
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              lVar16 = 0;
              while (iVar2 = (int)lVar16, iVar2 < (int)uVar12) {
                uVar4 = get8(s);
                uVar4 = uVar4 & 0xff;
                if (uVar4 < 0x81) {
                  lVar16 = (long)iVar2;
                  while (bVar17 = uVar4 != 0, uVar4 = uVar4 - 1, bVar17) {
                    iVar2 = get8(s);
                    *(char *)((long)pvVar15 + lVar16 * 4) = (char)iVar2;
                    lVar16 = lVar16 + 1;
                  }
                }
                else {
                  iVar6 = get8(s);
                  lVar16 = (long)iVar2;
                  for (uVar5 = 0; (uVar4 ^ uVar5) != 0x80; uVar5 = uVar5 + 1) {
                    *(char *)((long)pvVar15 + lVar16 * 4) = (char)iVar6;
                    lVar16 = lVar16 + 1;
                  }
                }
              }
              pvVar15 = (void *)((long)pvVar15 + 1);
            }
            output_00 = local_488;
            for (lVar14 = 0; (uVar8 & 0xffffffff) << 2 != lVar14; lVar14 = lVar14 + 4) {
              hdr_convert(output_00,(stbi_uc *)((long)__ptr + lVar14),iVar1);
              output_00 = output_00 + iVar1;
            }
            uVar9 = uVar9 + 1;
            local_488 = local_488 + (long)iVar1 * (uVar8 & 0xffffffff);
          }
          rgbe[0] = (stbi_uc)iVar2;
          rgbe[1] = (stbi_uc)iVar3;
          rgbe[2] = (stbi_uc)uVar4;
          iVar2 = get8(s);
          rgbe[3] = (stbi_uc)iVar2;
          hdr_convert(output,rgbe,iVar1);
          free(__ptr);
          iVar2 = 0;
          do {
            getn(s,rgbe_1,4);
            hdr_convert(output + (long)(int)(iVar1 * uVar12 * iVar2) + (long)(iVar6 * iVar1),rgbe_1,
                        iVar1);
            iVar6 = iVar6 + 1;
            while ((int)uVar12 <= iVar6) {
              iVar2 = iVar2 + 1;
LAB_00108972:
              iVar6 = 0;
              if (iVar13 <= iVar2) {
                return output;
              }
            }
          } while( true );
        }
      }
    }
    failure_reason = "Unsupported HDR format";
  }
  else {
    failure_reason = "Corrupt HDR image";
  }
  return (float *)0x0;
}

Assistant:

static float *hdr_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	float *hdr_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epf("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

   *comp = 3;
	if (req_comp == 0) req_comp = 3;

	// Read data
	hdr_data = (float *) malloc(height * width * req_comp * sizeof(float));

	// Load image data
   // image data is stored as some number of sca
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            getn(s, rgbe, 4);
            hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
	} else {
		// Read RLE-encoded data
		scanline = NULL;

		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4] = { c1,c2,len, get8(s) };
            hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            free(scanline);
            goto main_decode_loop; // yes, this is fucking insane; blame the fucking insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(hdr_data); free(scanline); return epf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) malloc(width * 4);

			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
         for (i=0; i < width; ++i)
            hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
		}
      free(scanline);
	}

   return hdr_data;
}